

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

bool __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
should_expand_right(Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                    *this)

{
  int iVar1;
  int iVar2;
  bool local_19;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *this_local;
  
  if ((this->root_node_->is_leaf_ & 1U) == 0) {
    if (((this->istats_).num_keys_above_key_domain < 5) ||
       (iVar1 = (this->istats_).num_keys_above_key_domain,
       iVar2 = (this->stats_).num_keys / (this->istats_).num_keys_at_last_right_domain_resize + -1,
       local_19 = true, SBORROW4(iVar1,iVar2 * 2) != iVar1 + iVar2 * -2 < 0)) {
      local_19 = 999 < (this->istats_).num_keys_above_key_domain;
    }
    return local_19;
  }
  return false;
}

Assistant:

bool should_expand_right() const {
    return (!root_node_->is_leaf_ &&
            ((istats_.num_keys_above_key_domain >= kMinOutOfDomainKeys &&
              istats_.num_keys_above_key_domain >=
                  kOutOfDomainToleranceFactor *
                      (stats_.num_keys /
                           istats_.num_keys_at_last_right_domain_resize -
                       1)) ||
             istats_.num_keys_above_key_domain >= kMaxOutOfDomainKeys));
  }